

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier-test-tools.cpp
# Opt level: O2

void __thiscall bezier::test::fuzzyCheckPoint(test *this,Point p,double x,double y,double epsilon)

{
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  Point p_local;
  AssertionHandler catchAssertionHandler;
  WithinAbsMatcher local_c0;
  ITransientExpression local_88;
  Point *local_78;
  WithinAbsMatcher *local_70;
  ScopedMessage scopedMessage1;
  
  p_local.y = p.y;
  local_c0.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x1c3009;
  local_c0.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x5;
  macroName.m_size = 4;
  macroName.m_start = "INFO";
  p_local.x = p.x;
  Catch::MessageBuilder::MessageBuilder
            ((MessageBuilder *)&catchAssertionHandler,macroName,(SourceLineInfo *)&local_c0,Info);
  std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.macroName.m_size,
                  "Failure: fuzzyCheckPoint((");
  std::ostream::_M_insert<double>(p.x);
  std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.macroName.m_size,",");
  std::ostream::_M_insert<double>(p_local.y);
  std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.macroName.m_size,"), ");
  std::ostream::_M_insert<double>(x);
  std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.macroName.m_size,", ");
  std::ostream::_M_insert<double>(y);
  std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.macroName.m_size,", ");
  std::ostream::_M_insert<double>(epsilon);
  std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.macroName.m_size,");");
  Catch::ScopedMessage::ScopedMessage(&scopedMessage1,(MessageBuilder *)&catchAssertionHandler);
  Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)&catchAssertionHandler);
  local_c0.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x1c3009;
  local_c0.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x6;
  macroName_00.m_size = 10;
  macroName_00.m_start = "CHECK_THAT";
  capturedExpression.m_size = 0x2b;
  capturedExpression.m_start = "p.x, Catch::Matchers::WithinAbs(x, epsilon)";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)&local_c0,capturedExpression,
             ContinueOnFailure);
  Catch::Matchers::WithinAbs(&local_c0,x,epsilon);
  local_88.m_result = Catch::Matchers::WithinAbsMatcher::match(&local_c0,&p_local.x);
  local_88.m_isBinaryExpression = true;
  local_88._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ff3c0;
  local_78 = &p_local;
  local_70 = &local_c0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_88);
  Catch::ITransientExpression::~ITransientExpression(&local_88);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_c0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_c0.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x1c3009;
  local_c0.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x7;
  macroName_01.m_size = 10;
  macroName_01.m_start = "CHECK_THAT";
  capturedExpression_00.m_size = 0x2b;
  capturedExpression_00.m_start = "p.y, Catch::Matchers::WithinAbs(y, epsilon)";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)&local_c0,capturedExpression_00,
             ContinueOnFailure);
  Catch::Matchers::WithinAbs(&local_c0,y,epsilon);
  local_88.m_result = Catch::Matchers::WithinAbsMatcher::match(&local_c0,&p_local.y);
  local_88.m_isBinaryExpression = true;
  local_88._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ff3c0;
  local_78 = (Point *)&p_local.y;
  local_70 = &local_c0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_88);
  Catch::ITransientExpression::~ITransientExpression(&local_88);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_c0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  Catch::ScopedMessage::~ScopedMessage(&scopedMessage1);
  return;
}

Assistant:

void bezier::test::fuzzyCheckPoint(const ::bezier::Point p, const double x, const double y, const double epsilon)
{
    INFO("Failure: fuzzyCheckPoint((" << p.x << "," << p.y << "), " << x << ", " << y << ", " << epsilon << ");");
    CHECK_THAT(p.x, Catch::Matchers::WithinAbs(x, epsilon));
    CHECK_THAT(p.y, Catch::Matchers::WithinAbs(y, epsilon));
}